

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::DvpLogRenderPass_PSOMismatch(DeviceContextVkImpl *this)

{
  PipelineStateVkImpl *this_00;
  char *pcVar1;
  TextureViewVkImpl *pTVar2;
  int iVar3;
  int iVar4;
  GraphicsPipelineDesc *pGVar5;
  size_t sVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureFormatAttribs *pTVar8;
  undefined4 extraout_var_01;
  char (*in_RCX) [93];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  ulong uVar9;
  string msg;
  stringstream ss;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  pGVar5 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                     (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                       m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Active render pass is incompatible with PSO \'",0x2d);
  pcVar1 = (this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           .m_Desc.super_DeviceObjectAttribs.Name;
  if (pcVar1 == (char *)0x0) {
    in_RCX = (char (*) [93])local_1a8;
    std::ios::clear((int)in_RCX + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar6 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\'. This indicates the mismatch between the number and/or format of bound render targets and/or depth stencil buffer and the PSO. Vulkan requires exact match.\n    Bound render targets ("
             ,0xb8);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"):",2);
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets == 0) {
    iVar4 = 0;
  }
  else {
    uVar9 = 0;
    iVar4 = 0;
    do {
      local_1f8._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f8,1);
      pTVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets[uVar9].
               m_pObject;
      if (pTVar2 == (TextureViewVkImpl *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<Not set>",9);
      }
      else {
        if ((iVar4 != 0) &&
           (iVar3 = (*(((pTVar2->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                      super_IDeviceObject).super_IObject._vptr_IObject[4])(),
           iVar4 != *(int *)(CONCAT44(extraout_var,iVar3) + 0x20))) {
          FormatString<char[26],char[77]>
                    (&local_1f8,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "SampleCount == 0 || SampleCount == pRTV->GetTexture()->GetDesc().SampleCount",
                     (char (*) [77])in_RCX);
          in_RCX = (char (*) [93])0x2b1;
          DebugAssertionFailed
                    ((Char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                      local_1f8._M_dataplus._M_p._0_1_),
                     "DvpLogRenderPass_PSOMismatch",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x2b1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
              &local_1f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                     local_1f8._M_dataplus._M_p._0_1_),
                            local_1f8.field_2._M_allocated_capacity + 1);
          }
        }
        iVar4 = (*(((pTVar2->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                  super_IDeviceObject).super_IObject._vptr_IObject[4])();
        iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x20);
        pTVar8 = GetTextureFormatAttribs
                           ((pTVar2->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                            super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                            .m_Desc.Format);
        pcVar1 = pTVar8->Name;
        if (pcVar1 == (char *)0x0) {
          in_RCX = (char (*) [93])local_1a8;
          std::ios::clear((int)in_RCX + (int)*(undefined8 *)(local_1a8[0] + -0x18));
        }
        else {
          sVar6 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar6);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                     super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; DSV: ",7);
  pTVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if (pTVar2 == (TextureViewVkImpl *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<Not set>",9);
  }
  else {
    if ((iVar4 != 0) &&
       (iVar3 = (*(((pTVar2->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                  super_IDeviceObject).super_IObject._vptr_IObject[4])(),
       iVar4 != *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x20))) {
      FormatString<char[26],char[93]>
                (&local_1f8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "SampleCount == 0 || SampleCount == m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount"
                 ,in_RCX);
      DebugAssertionFailed
                ((Char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_)
                 ,"DvpLogRenderPass_PSOMismatch",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,699);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
          &local_1f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                        local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    (*(((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)->
        super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->super_IDeviceObject).
      super_IObject._vptr_IObject[4])();
    pTVar8 = GetTextureFormatAttribs
                       ((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil
                         .m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                        .m_Desc.Format);
    pcVar1 = pTVar8->Name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar6);
    }
    if ((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)->
        super_TextureViewBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
        .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (read-only)",0xc);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; Sample count: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap.m_pObject !=
      (ITextureView *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; VRS",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n    PSO: render targets (",0x1a);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"): ",3);
  if (pGVar5->NumRenderTargets != '\0') {
    uVar9 = 0;
    do {
      local_1f8._M_dataplus._M_p._0_1_ = 0x20;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1f8,1);
      pTVar8 = GetTextureFormatAttribs(pGVar5->RTVFormats[uVar9]);
      pcVar1 = pTVar8->Name;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar1,sVar6);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < pGVar5->NumRenderTargets);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; DSV: ",7);
  pTVar8 = GetTextureFormatAttribs(pGVar5->DSVFormat);
  pcVar1 = pTVar8->Name;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar6 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar6);
  }
  if (pGVar5->ReadOnlyDSV == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (read-only)",0xc);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; Sample count: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  if ((pGVar5->ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_LAST) !=
      PIPELINE_SHADING_RATE_FLAG_NONE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; VRS",5);
  }
  std::__cxx11::stringbuf::str();
  FormatString<std::__cxx11::string>(&local_1f8,(Diligent *)local_1d8,Args);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)
              (2,CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
      &local_1f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                    local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void DeviceContextVkImpl::DvpLogRenderPass_PSOMismatch()
{
    const PipelineStateDesc&    Desc       = m_pPipelineState->GetDesc();
    const GraphicsPipelineDesc& GrPipeline = m_pPipelineState->GetGraphicsPipelineDesc();

    std::stringstream ss;
    ss << "Active render pass is incompatible with PSO '" << Desc.Name
       << "'. This indicates the mismatch between the number and/or format of bound render "
          "targets and/or depth stencil buffer and the PSO. Vulkan requires exact match.\n"
          "    Bound render targets ("
       << m_NumBoundRenderTargets << "):";
    Uint32 SampleCount = 0;
    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        ss << ' ';
        if (TextureViewVkImpl* pRTV = m_pBoundRenderTargets[rt])
        {
            VERIFY_EXPR(SampleCount == 0 || SampleCount == pRTV->GetTexture()->GetDesc().SampleCount);
            SampleCount = pRTV->GetTexture()->GetDesc().SampleCount;
            ss << GetTextureFormatAttribs(pRTV->GetDesc().Format).Name;
        }
        else
            ss << "<Not set>";
    }
    ss << "; DSV: ";
    if (m_pBoundDepthStencil)
    {
        VERIFY_EXPR(SampleCount == 0 || SampleCount == m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount);
        SampleCount = m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount;
        ss << GetTextureFormatAttribs(m_pBoundDepthStencil->GetDesc().Format).Name;
        if (m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            ss << " (read-only)";
    }
    else
        ss << "<Not set>";
    ss << "; Sample count: " << SampleCount;

    if (m_pBoundShadingRateMap)
        ss << "; VRS";

    ss << "\n    PSO: render targets (" << Uint32{GrPipeline.NumRenderTargets} << "): ";
    for (Uint32 rt = 0; rt < GrPipeline.NumRenderTargets; ++rt)
        ss << ' ' << GetTextureFormatAttribs(GrPipeline.RTVFormats[rt]).Name;
    ss << "; DSV: " << GetTextureFormatAttribs(GrPipeline.DSVFormat).Name;
    if (GrPipeline.ReadOnlyDSV)
        ss << " (read-only)";
    ss << "; Sample count: " << Uint32{GrPipeline.SmplDesc.Count};

    if (GrPipeline.ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_TEXTURE_BASED)
        ss << "; VRS";

    LOG_ERROR_MESSAGE(ss.str());
}